

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O1

uint RDL_getNodesForRingsystem(RDL_data *data,uint idx,RDL_node **nodes)

{
  uint uVar1;
  RDL_graph *pRVar2;
  uint *puVar3;
  RDL_node *pRVar4;
  ulong uVar5;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
  }
  else {
    if (idx < data->bccGraphs->nof_bcc) {
      pRVar4 = (RDL_node *)malloc((ulong)data->bccGraphs->bcc_graphs[idx]->V << 3);
      *nodes = pRVar4;
      pRVar2 = data->bccGraphs->bcc_graphs[idx];
      if (pRVar2->V == 0) {
        return 0;
      }
      puVar3 = data->bccGraphs->node_from_bcc_mapping[idx];
      uVar5 = 0;
      do {
        pRVar4[uVar5] = puVar3[uVar5];
        uVar5 = uVar5 + 1;
        uVar1 = pRVar2->V;
      } while (uVar5 < uVar1);
      return uVar1;
    }
    (*RDL_outputFunc)(RDL_ERROR,"idx %d is out of range!\n");
  }
  pRVar4 = (RDL_node *)malloc(4);
  *nodes = pRVar4;
  return 0xffffffff;
}

Assistant:

unsigned RDL_getNodesForRingsystem(
    const RDL_data *data, unsigned idx, RDL_node** nodes)
{
  unsigned i, node;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*nodes) = malloc(sizeof(**nodes));
    return RDL_INVALID_RESULT;
  }

  if(idx >= data->bccGraphs->nof_bcc) {
    RDL_outputFunc(RDL_ERROR, "idx %d is out of range!\n", idx);
    (*nodes) = malloc(sizeof(**nodes));
    return RDL_INVALID_RESULT;
  }

  (*nodes) = malloc(data->bccGraphs->bcc_graphs[idx]->V * sizeof(*nodes));

  for (i = 0; i < data->bccGraphs->bcc_graphs[idx]->V; ++i) {
    node = data->bccGraphs->node_from_bcc_mapping[idx][i];
    (*nodes)[i] = node;
  }

  return data->bccGraphs->bcc_graphs[idx]->V;
}